

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::SSARewriter::ProcessLoad(SSARewriter *this,Instruction *inst,BasicBlock *bb)

{
  IRContext *this_00;
  TypeManager *this_01;
  iterator __position;
  bool bVar1;
  short sVar2;
  uint32_t uVar3;
  uint32_t id;
  int iVar4;
  Type *pTVar5;
  Instruction *this_02;
  Type *pTVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  IRContext *this_03;
  uint32_t var_id;
  uint32_t load_id;
  uint32_t local_80;
  uint local_7c;
  Instruction *local_78;
  DefUseManager *local_70;
  BasicBlock *local_68;
  _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
  local_60;
  
  local_80 = 0;
  local_68 = bb;
  MemPass::GetPtr(this->pass_,inst,&local_80);
  this_00 = (this->pass_->super_Pass).context_;
  sVar2 = (short)this_00->valid_analyses_;
  this_03 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
    this_03 = (this->pass_->super_Pass).context_;
    sVar2 = (short)this_03->valid_analyses_;
  }
  local_70 = (this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (-1 < sVar2) {
    IRContext::BuildTypeManager(this_03);
  }
  this_01 = (this_03->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar3 = 0;
  if (inst->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(inst,0);
  }
  pTVar5 = analysis::TypeManager::GetType(this_01,uVar3);
  bVar1 = MemPass::IsTargetVar(this->pass_,local_80);
  if (bVar1) {
    local_78 = inst;
    do {
      uVar3 = GetReachingDef(this,local_80,local_68);
      if (uVar3 == 0) break;
      this_02 = analysis::DefUseManager::GetDef(local_70,uVar3);
      if (this_02 == (Instruction *)0x0) {
LAB_004fea29:
        local_7c = 0;
        if (local_78->has_result_id_ == true) {
          local_7c = Instruction::GetSingleWordOperand(local_78,(uint)local_78->has_type_id_);
        }
        cVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->load_replacement_)._M_h,&local_7c);
        if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          pmVar8 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->load_replacement_,&local_7c);
          *pmVar8 = uVar3;
          local_60._M_impl._0_4_ = uVar3;
          iVar9 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->phi_candidates_)._M_h,(key_type_conflict *)&local_60);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
              ._M_cur != (__node_type *)0x0) {
            local_60._M_impl._0_4_ = local_7c;
            __position._M_current =
                 *(uint **)((long)iVar9.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                                  ._M_cur + 0x48);
            if (__position._M_current ==
                *(uint **)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                                 ._M_cur + 0x50)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         ((long)iVar9.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                                ._M_cur + 0x40),__position,(uint *)&local_60);
            }
            else {
              *__position._M_current = local_7c;
              *(uint **)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                               ._M_cur + 0x48) = __position._M_current + 1;
            }
          }
          return true;
        }
        __assert_fail("load_replacement_.count(load_id) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                      ,0x192,
                      "bool spvtools::opt::SSARewriter::ProcessLoad(Instruction *, BasicBlock *)");
      }
      id = 0;
      if (this_02->has_type_id_ == true) {
        id = Instruction::GetSingleWordOperand(this_02,0);
      }
      pTVar6 = analysis::TypeManager::GetType(this_01,id);
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar4 = (*pTVar6->_vptr_Type[2])(pTVar6,pTVar5,&local_60);
      std::
      _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
      ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
      if ((char)iVar4 != '\0') goto LAB_004fea29;
      local_80 = uVar3;
      bVar1 = MemPass::IsTargetVar(this->pass_,uVar3);
    } while (bVar1);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool SSARewriter::ProcessLoad(Instruction* inst, BasicBlock* bb) {
  // Get the pointer that we are using to load from.
  uint32_t var_id = 0;
  (void)pass_->GetPtr(inst, &var_id);

  // Get the immediate reaching definition for |var_id|.
  //
  // In the presence of variable pointers, the reaching definition may be
  // another pointer.  For example, the following fragment:
  //
  //  %2 = OpVariable %_ptr_Input_float Input
  // %11 = OpVariable %_ptr_Function__ptr_Input_float Function
  //       OpStore %11 %2
  // %12 = OpLoad %_ptr_Input_float %11
  // %13 = OpLoad %float %12
  //
  // corresponds to the pseudo-code:
  //
  // layout(location = 0) in flat float *%2
  // float %13;
  // float *%12;
  // float **%11;
  // *%11 = %2;
  // %12 = *%11;
  // %13 = *%12;
  //
  // which ultimately, should correspond to:
  //
  // %13 = *%2;
  //
  // During rewriting, the pointer %12 is found to be replaceable by %2 (i.e.,
  // load_replacement_[12] is 2). However, when processing the load
  // %13 = *%12, the type of %12's reaching definition is another float
  // pointer (%2), instead of a float value.
  //
  // When this happens, we need to continue looking up the reaching definition
  // chain until we get to a float value or a non-target var (i.e. a variable
  // that cannot be SSA replaced, like %2 in this case since it is a function
  // argument).
  analysis::DefUseManager* def_use_mgr = pass_->context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = pass_->context()->get_type_mgr();
  analysis::Type* load_type = type_mgr->GetType(inst->type_id());
  uint32_t val_id = 0;
  bool found_reaching_def = false;
  while (!found_reaching_def) {
    if (!pass_->IsTargetVar(var_id)) {
      // If the variable we are loading from is not an SSA target (globals,
      // function parameters), do nothing.
      return true;
    }

    val_id = GetReachingDef(var_id, bb);
    if (val_id == 0) {
      return false;
    }

    // If the reaching definition is a pointer type different than the type of
    // the instruction we are analyzing, then it must be a reference to another
    // pointer (otherwise, this would be invalid SPIRV).  We continue
    // de-referencing it by making |val_id| be |var_id|.
    //
    // NOTE: if there is no reaching definition instruction, it means |val_id|
    // is an undef.
    Instruction* reaching_def_inst = def_use_mgr->GetDef(val_id);
    if (reaching_def_inst &&
        !type_mgr->GetType(reaching_def_inst->type_id())->IsSame(load_type)) {
      var_id = val_id;
    } else {
      found_reaching_def = true;
    }
  }

  // Schedule a replacement for the result of this load instruction with
  // |val_id|. After all the rewriting decisions are made, every use of
  // this load will be replaced with |val_id|.
  uint32_t load_id = inst->result_id();
  assert(load_replacement_.count(load_id) == 0);
  load_replacement_[load_id] = val_id;
  PhiCandidate* defining_phi = GetPhiCandidate(val_id);
  if (defining_phi) {
    defining_phi->AddUser(load_id);
  }

#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  std::cerr << "\tFound load: "
            << inst->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
            << " (replacement for %" << load_id << " is %" << val_id << ")\n";
#endif

  return true;
}